

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyPubKeyInner
          (LegacyScriptPubKeyMan *this,CKey *key,CPubKey *pubkey)

{
  array<unsigned_char,_32UL> *paVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  CKeyingMaterial vchSecret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchCryptedSecret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[9])
                    ();
  if ((char)iVar4 == '\0') {
    bVar3 = FillableSigningProvider::AddKeyPubKey
                      (&(this->super_LegacyDataSPKM).super_FillableSigningProvider,key,pubkey);
  }
  else {
    iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
              [10])();
    if ((char)iVar4 == '\0') {
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar1 = (key->keydata)._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_char,secure_allocator<unsigned_char>>::
      _M_range_initialize<unsigned_char_const*>
                ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_78,paVar1,
                 paVar1 + (paVar1 != (array<unsigned_char,_32UL> *)0x0));
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      local_88 = (code *)0x0;
      pcStack_80 = (code *)0x0;
      local_98 = (undefined8 *)0x0;
      uStack_90 = 0;
      local_98 = (undefined8 *)operator_new(0x18);
      *local_98 = (vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_78;
      local_98[1] = pubkey;
      local_98[2] = &local_58;
      pcStack_80 = std::
                   _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:837:38)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:837:38)>
                 ::_M_manager;
      iVar4 = (*pWVar2->_vptr_WalletStorage[8])(pWVar2);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      if ((char)iVar4 == '\0') {
        bVar3 = false;
      }
      else {
        bVar3 = AddCryptedKey(this,pubkey,&local_58);
      }
      std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_78);
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar3 = false;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyPubKeyInner(const CKey& key, const CPubKey &pubkey)
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::AddKeyPubKey(key, pubkey);
    }

    if (m_storage.IsLocked()) {
        return false;
    }

    std::vector<unsigned char> vchCryptedSecret;
    CKeyingMaterial vchSecret{UCharCast(key.begin()), UCharCast(key.end())};
    if (!m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
            return EncryptSecret(encryption_key, vchSecret, pubkey.GetHash(), vchCryptedSecret);
        })) {
        return false;
    }

    if (!AddCryptedKey(pubkey, vchCryptedSecret)) {
        return false;
    }
    return true;
}